

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O3

char * __thiscall ContinuousPageStack<1UL>::Pop(ContinuousPageStack<1UL> *this,size_t size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  size_t sVar4;
  char *pcVar6;
  ulong uVar5;
  
  uVar5 = this->nextTop;
  if (uVar5 == 0) {
    pcVar6 = (char *)0x0;
  }
  else {
    if (size == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfc,"(size != 0)","size != 0");
      if (!bVar2) goto LAB_00ef27c4;
      *puVar3 = 0;
      uVar5 = this->nextTop;
    }
    if (uVar5 < size) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0xfd,"(nextTop >= size)","nextTop >= size");
      if (!bVar2) goto LAB_00ef27c4;
      *puVar3 = 0;
      uVar5 = this->nextTop;
    }
    sVar4 = uVar5 - size;
    this->nextTop = sVar4;
    if (this->bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar2) {
LAB_00ef27c4:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      sVar4 = this->nextTop;
    }
    pcVar6 = (char *)((long)&this->pageAllocation[1].pageCount + sVar4);
  }
  return pcVar6;
}

Assistant:

inline char* ContinuousPageStack<InitialPageCount>::Pop(const size_t size)
{
    if (nextTop == 0)
        return 0;
    else
    {
        Assert(size != 0);
        Assert(nextTop >= size);
        nextTop -= size;
        return Buffer() + nextTop;
    }
}